

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ea_dominator_tree.cpp
# Opt level: O1

void __thiscall ee_dataflow::compute_dominator_tree(ee_dataflow *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,std::allocator<int>> *pvVar1;
  pointer pvVar2;
  int *piVar3;
  iterator iVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  int w;
  int ndfn;
  vector<int,_std::allocator<int>_> semi;
  vector<int,_std::allocator<int>_> dfn;
  vector<int,_std::allocator<int>_> fa;
  vector<int,_std::allocator<int>_> inset;
  vector<int,_std::allocator<int>_> upset_minsemi;
  vector<int,_std::allocator<int>_> seq;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dom;
  anon_class_40_5_7c25027c dfs_dfn;
  anon_class_32_4_a787555a find;
  int local_130;
  int local_12c;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  ee_dataflow *local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  vector<int,_std::allocator<int>_> *local_78;
  int *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ee_dataflow *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_12c = 0;
  local_78 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_78._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_110,(long)this->n_exprs,(value_type_conflict2 *)&local_78,
             (allocator_type *)&local_50);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(long)this->n_exprs,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_128,(long)this->n_exprs,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f8,(long)this->n_exprs,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,(long)this->n_exprs,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)this->n_exprs,(allocator_type *)&local_78);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_90,(long)this->n_exprs,(allocator_type *)&local_78);
  this_00 = &this->idom;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->n_exprs);
  local_78 = &local_110;
  local_70 = &local_12c;
  *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       -1;
  local_68 = &local_b0;
  local_60 = this;
  local_58 = &local_f8;
  compute_dominator_tree()::$_0::operator()(&local_78,0,(anon_class_40_5_7c25027c *)&local_78);
  if (0 < this->n_exprs) {
    lVar10 = 0;
    do {
      iVar9 = (int)lVar10;
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = iVar9;
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = iVar9;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = iVar9;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->n_exprs);
  }
  local_48 = &local_110;
  local_40 = &local_128;
  local_50 = &local_e0;
  local_38 = &local_c8;
  if (1 < (long)local_12c) {
    lVar10 = (long)local_12c;
    local_98 = this;
    do {
      local_130 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10 + -1];
      pvVar2 = (local_98->e_in).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar2[local_130].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (piVar11 = pvVar2[local_130].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
        iVar9 = *piVar11;
        if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar9] != -1) {
          if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar9] != iVar9) {
            compute_dominator_tree()::$_1::operator()
                      (&local_50,iVar9,(anon_class_32_4_a787555a *)&local_50);
            iVar9 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar9];
          }
          if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar9]] <
              local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_130]]) {
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_130] =
                 local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9];
          }
        }
      }
      lVar8 = (long)local_130;
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar8] != local_130) {
        __assert_fail("inset[w] == w",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/ea_dominator_tree.cpp"
                      ,0x25,
                      "auto ee_dataflow::compute_dominator_tree()::(anonymous class)::operator()(int, int) const"
                     );
      }
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] =
           local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar8];
      pvVar1 = (vector<int,std::allocator<int>> *)
               (local_90.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_130]);
      iVar4._M_current = *(int **)(pvVar1 + 8);
      if (iVar4._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar1,iVar4,&local_130)
        ;
      }
      else {
        *iVar4._M_current = local_130;
        *(int **)(pvVar1 + 8) = iVar4._M_current + 1;
      }
      piVar3 = local_90.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_130]].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar11 = local_90.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_130]].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar11 != piVar3; piVar11 = piVar11 + 1) {
        iVar9 = *piVar11;
        iVar7 = iVar9;
        if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar9] != iVar9) {
          compute_dominator_tree()::$_1::operator()
                    (&local_50,iVar9,(anon_class_32_4_a787555a *)&local_50);
          iVar7 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar9];
        }
        if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9]] <=
            local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar7]]) {
          iVar7 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_130];
        }
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar9] = iVar7;
      }
      iVar9 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[local_130];
      piVar5 = local_90.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar9].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (local_90.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar9].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
          piVar5) {
        local_90.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar9].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             piVar5;
      }
      bVar6 = 2 < lVar10;
      this = local_98;
      lVar10 = lVar10 + -1;
    } while (bVar6);
  }
  piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *piVar5 = -1;
  if (1 < local_12c) {
    lVar10 = 1;
    do {
      iVar9 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar10];
      if (piVar5[iVar9] !=
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar9]) {
        piVar5[iVar9] = piVar5[piVar5[iVar9]];
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_12c);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->doms,(long)this->n_exprs);
  local_130 = 1;
  if (1 < this->n_exprs) {
    do {
      lVar10 = (long)local_130;
      piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] == -1) {
        piVar5[lVar10] = -1;
      }
      else {
        pvVar1 = (vector<int,std::allocator<int>> *)
                 ((this->doms).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + piVar5[lVar10]);
        iVar4._M_current = *(int **)(pvVar1 + 8);
        if (iVar4._M_current == *(int **)(pvVar1 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar1,iVar4,&local_130);
        }
        else {
          *iVar4._M_current = local_130;
          *(int **)(pvVar1 + 8) = iVar4._M_current + 1;
        }
      }
      local_130 = local_130 + 1;
    } while (local_130 < this->n_exprs);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_90);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ee_dataflow::compute_dominator_tree() {
  int ndfn = 0;
  std::vector<int> dfn(n_exprs, -1), seq(n_exprs), semi(n_exprs), fa(n_exprs), inset(n_exprs), upset_minsemi(n_exprs);
  std::vector<std::vector<int>> dom(n_exprs);
  idom.resize(n_exprs);

  // compute dfs sequence
  const auto dfs_dfn = [&] (int u, auto &&dfs_dfn) -> void {
    dfn[u] = ndfn++;
    seq[dfn[u]] = u;
    for(int v: e_out[u]) if(dfn[v] == -1) {
        fa[v] = u;
        dfs_dfn(v, dfs_dfn);
      }
  };
  fa[0] = -1;
  dfs_dfn(0, dfs_dfn);

  // compute semi dominator
  for(int i = 0; i < n_exprs; ++i) {
    semi[i] = i;
    inset[i] = i;
    upset_minsemi[i] = i;
  }
  const auto link = [&] (int v, int w) {
    assert(inset[w] == w);
    inset[w] = v;
  };
  const auto find = [&] (int v, auto &&find) {
    if(inset[v] == v) return v;
    int p = find(inset[v], find);
    if(dfn[semi[upset_minsemi[p]]] < dfn[semi[upset_minsemi[v]]])
      upset_minsemi[v] = upset_minsemi[p];
    return inset[v] = p;
  };
  const auto eval = [&] (int v) {
    if(inset[v] == v) return v;
    else {
      find(v, find);
      return upset_minsemi[v];
    }
  };
  
  for(int i = ndfn - 1; i >= 1; --i) {
    int w = seq[i];
    for(int v: e_in[w]) {
      if(dfn[v] == -1) continue;
      int u = eval(v);
      if(dfn[semi[u]] < dfn[semi[w]]) semi[w] = semi[u];
    }
    link(fa[w], w);
    dom[semi[w]].push_back(w);
    for(int v: dom[fa[w]]) {
      int u = eval(v);
      idom[v] = (dfn[semi[u]] < dfn[semi[v]]) ? u : fa[w];
    }
    dom[fa[w]].clear();
  }

  // finalize immediate dominator
  idom[0] = -1;
  for(int i = 1; i < ndfn; ++i) {
    int w = seq[i];
    if(idom[w] != semi[w]) idom[w] = idom[idom[w]];
  }
  doms.resize(n_exprs);
  for(int i = 1; i < n_exprs; ++i) {
    if(dfn[i] == -1) idom[i] = -1;
    else doms[idom[i]].push_back(i);
  }
}